

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_printf_html_escape(mg_connection *nc,char *fmt,...)

{
  char *__ptr;
  char in_AL;
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *buf_00;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  char mem [100];
  char *local_180;
  __va_list_tag local_178;
  char local_158 [112];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_178.reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_180 = local_158;
  local_178.overflow_arg_area = &buf;
  local_178.gp_offset = 0x10;
  local_178.fp_offset = 0x30;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  uVar1 = mg_avprintf(&local_180,100,fmt,&local_178);
  __ptr = local_180;
  if (-1 < (int)uVar1) {
    if (uVar1 == 0) {
      iVar2 = 0;
    }
    else {
      uVar3 = 0;
      iVar2 = 0;
      do {
        if ((byte)(__ptr[uVar3] | 2U) == 0x3e) {
          mg_send(nc,__ptr + iVar2,(int)uVar3 - iVar2);
          buf_00 = "&gt;";
          if (__ptr[uVar3] == '<') {
            buf_00 = "&lt;";
          }
          mg_send(nc,buf_00,4);
          iVar2 = (int)uVar3 + 1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar1);
    }
    mg_send(nc,__ptr + iVar2,uVar1 - iVar2);
  }
  if (__ptr != (char *)0x0 && __ptr != local_158) {
    free(__ptr);
  }
  return;
}

Assistant:

void mg_printf_html_escape(struct mg_connection *nc, const char *fmt, ...) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int i, j, len;
    va_list ap;

    va_start(ap, fmt);
    len = mg_avprintf(&buf, sizeof(mem), fmt, ap);
    va_end(ap);

    if (len >= 0) {
        for (i = j = 0; i < len; i++) {
            if (buf[i] == '<' || buf[i] == '>') {
                mg_send(nc, buf + j, i - j);
                mg_send(nc, buf[i] == '<' ? "&lt;" : "&gt;", 4);
                j = i + 1;
            }
        }
        mg_send(nc, buf + j, i - j);
    }

    /* LCOV_EXCL_START */
    if (buf != mem && buf != NULL) {
        MG_FREE(buf);
    }
    /* LCOV_EXCL_STOP */
}